

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QSharedPointer<QRelation>_>::reallocateAndGrow
          (QArrayDataPointer<QSharedPointer<QRelation>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QSharedPointer<QRelation>_> *old)

{
  QBasicAtomicInt *pQVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  Data *pDVar4;
  qsizetype qVar5;
  QSharedPointer<QRelation> *pQVar6;
  QSharedPointer<QRelation> *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<QSharedPointer<QRelation>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QSharedPointer<QRelation>_> *)0x0 && where == GrowsAtEnd) &&
       (pQVar2 = &this->d->super_QArrayData, pQVar2 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar9 = QArrayData::reallocateUnaligned
                       (pQVar2,this->ptr,0x10,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4),
                        Grow);
    this->d = (Data *)auVar9._0_8_;
    this->ptr = (QSharedPointer<QRelation> *)auVar9._8_8_;
  }
  else {
    local_38.size = -0x5555555555555556;
    local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_38.ptr = (QSharedPointer<QRelation> *)0xaaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar8 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QSharedPointer<QRelation>_> *)0x0)
          ) || (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        pQVar6 = this->ptr;
        pQVar7 = pQVar6 + lVar8;
        if ((lVar8 != 0) && (0 < lVar8)) {
          do {
            local_38.ptr[local_38.size].value.ptr = (pQVar6->value).ptr;
            pDVar3 = pQVar6->d;
            local_38.ptr[local_38.size].d = pDVar3;
            if (pDVar3 != (Data *)0x0) {
              LOCK();
              (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
                   (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
              LOCK();
              pQVar1 = &(local_38.ptr[local_38.size].d)->strongref;
              (pQVar1->_q_value).super___atomic_base<int>._M_i =
                   (pQVar1->_q_value).super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pQVar6 = pQVar6 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar6 < pQVar7);
        }
      }
      else {
        pQVar6 = this->ptr;
        pQVar7 = pQVar6 + lVar8;
        if ((lVar8 != 0) && (0 < lVar8)) {
          do {
            pDVar3 = pQVar6->d;
            local_38.ptr[local_38.size].value.ptr = (pQVar6->value).ptr;
            local_38.ptr[local_38.size].d = pDVar3;
            (pQVar6->value).ptr = (QRelation *)0x0;
            pQVar6->d = (Data *)0x0;
            pQVar6 = pQVar6 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar6 < pQVar7);
        }
      }
    }
    pDVar4 = this->d;
    pQVar6 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    qVar5 = this->size;
    this->size = local_38.size;
    local_38.d = pDVar4;
    local_38.ptr = pQVar6;
    local_38.size = qVar5;
    if (old != (QArrayDataPointer<QSharedPointer<QRelation>_> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar4;
      old->ptr = pQVar6;
      local_38.size = old->size;
      old->size = qVar5;
    }
    ~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }